

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_lat.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined4 local_4c;
  int local_48;
  int opt;
  int i;
  int rc;
  int s;
  int nbytes;
  char *buf;
  size_t sStack_28;
  int rts;
  size_t sz;
  char *bind_to;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  bind_to = (char *)argv;
  argv_local._0_4_ = argc;
  if (argc == 4) {
    sz = (size_t)argv[1];
    iVar1 = atoi(argv[2]);
    sStack_28 = (size_t)iVar1;
    buf._4_4_ = atoi(*(char **)(bind_to + 0x18));
    i = nn_socket(1,0x10);
    if (i == -1) {
      __assert_fail("s != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/perf/local_lat.c"
                    ,0x35,"int main(int, char **)");
    }
    local_4c = 1;
    opt = nn_setsockopt(i,0xfffffffd,1,&local_4c,4);
    if (opt != 0) {
      __assert_fail("rc == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/perf/local_lat.c"
                    ,0x38,"int main(int, char **)");
    }
    opt = nn_bind(i,sz);
    if (opt < 0) {
      __assert_fail("rc >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/perf/local_lat.c"
                    ,0x3a,"int main(int, char **)");
    }
    _s = malloc(sStack_28);
    if (_s == (void *)0x0) {
      __assert_fail("buf",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/perf/local_lat.c"
                    ,0x3d,"int main(int, char **)");
    }
    memset(_s,0x6f,sStack_28);
    for (local_48 = 0; local_48 != buf._4_4_; local_48 = local_48 + 1) {
      rc = nn_recv(i,_s,sStack_28,0);
      if (rc != (int)sStack_28) {
        __assert_fail("nbytes == (int)sz",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/perf/local_lat.c"
                      ,0x42,"int main(int, char **)");
      }
      rc = nn_send(i,_s,sStack_28,0);
      if (rc != (int)sStack_28) {
        __assert_fail("nbytes == (int)sz",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/perf/local_lat.c"
                      ,0x44,"int main(int, char **)");
      }
    }
    free(_s);
    opt = nn_close(i);
    if (opt != 0) {
      __assert_fail("rc == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/perf/local_lat.c"
                    ,0x4a,"int main(int, char **)");
    }
    argv_local._4_4_ = 0;
  }
  else {
    printf("usage: local_lat <bind-to> <msg-size> <roundtrips>\n");
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main (int argc, char *argv [])
{
    const char *bind_to;
    size_t sz;
    int rts;
    char *buf;
    int nbytes;
    int s;
    int rc;
    int i;
    int opt;

    if (argc != 4) {
        printf ("usage: local_lat <bind-to> <msg-size> <roundtrips>\n");
        return 1;
    }
    bind_to = argv [1];
    sz = atoi (argv [2]);
    rts = atoi (argv [3]);

    s = nn_socket (AF_SP, NN_PAIR);
    assert (s != -1);
    opt = 1;
    rc = nn_setsockopt (s, NN_TCP, NN_TCP_NODELAY, &opt, sizeof (opt));
    assert (rc == 0);
    rc = nn_bind (s, bind_to);
    assert (rc >= 0);

    buf = malloc (sz);
    assert (buf);
    memset (buf, 111, sz);

    for (i = 0; i != rts; i++) {
        nbytes = nn_recv (s, buf, sz, 0);
        assert (nbytes == (int)sz);
        nbytes = nn_send (s, buf, sz, 0);
        assert (nbytes == (int)sz);
    }

    free (buf);

    rc = nn_close (s);
    assert (rc == 0);

    return 0;
}